

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void pop_macro_call(c2m_ctx_t c2m_ctx)

{
  macro_call_t mc_00;
  macro_call_t mc;
  pre_ctx_t pre_ctx;
  c2m_ctx_t c2m_ctx_local;
  
  mc_00 = VARR_macro_call_tpop(c2m_ctx->pre_ctx->macro_call_stack);
  mc_00->macro->ignore_p = 0;
  free_macro_call(mc_00);
  return;
}

Assistant:

static void pop_macro_call (c2m_ctx_t c2m_ctx) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_call_t mc;

  mc = VARR_POP (macro_call_t, macro_call_stack);
#ifdef C2MIR_PREPRO_DEBUG
  fprintf (stderr, "finish call of macro %s\n", mc->macro->id->repr);
#endif
  mc->macro->ignore_p = FALSE;
  free_macro_call (mc);
}